

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O1

QNetworkReply * __thiscall
QNetworkAccessManager::createRequest
          (QNetworkAccessManager *this,Operation op,QNetworkRequest *originalReq,
          QIODevice *outgoingData)

{
  QNetworkAccessManagerPrivate *this_00;
  QNetworkReplyImplPrivate *pQVar1;
  Data *pDVar2;
  QNetworkCookieJar *pQVar3;
  QAnyStringView value;
  QAnyStringView newValue;
  QArrayData *pQVar4;
  Operation op_00;
  char cVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  milliseconds mVar10;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  Data *pDVar11;
  QNetworkAccessCacheBackend *this_02;
  char16_t (*pacVar12) [17];
  QObject *pQVar13;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QUrl stsUrl;
  QHttpHeaders h;
  QNetworkRequest request;
  QNetworkRequest req;
  char16_t httpSchemes [5] [17];
  QNetworkRequest local_1d8;
  QNetworkRequest local_1d0;
  QNetworkRequest local_1c8;
  QNetworkRequest local_1c0;
  QArrayData *local_1b8;
  storage_type_conflict *psStack_1b0;
  undefined1 *local_1a8;
  QNetworkRequest local_198;
  Operation local_18c;
  anon_union_24_3_e3d07ef4_for_data local_188 [7];
  char16_t local_de [3];
  anon_union_24_3_e3d07ef4_for_data local_d8;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 local_a0;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkAccessManagerPrivate **)(this + 8);
  local_198.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_18c = op;
  QNetworkRequest::QNetworkRequest(&local_198,originalReq);
  if (*(int *)(*(long *)(this + 8) + 0xa4) == 1) {
    cVar6 = '\0';
  }
  else {
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    QNetworkRequest::attribute(&local_58,&local_198,RedirectPolicyAttribute,(QVariant *)&local_78);
    cVar6 = QVariant::isNull();
    QVariant::~QVariant(&local_58);
    QVariant::~QVariant((QVariant *)&local_78);
  }
  if (cVar6 != '\0') {
    QVariant::QVariant((QVariant *)local_188,*(int *)(*(long *)(this + 8) + 0xa4));
    QNetworkRequest::setAttribute(&local_198,RedirectPolicyAttribute,(QVariant *)local_188);
    QVariant::~QVariant((QVariant *)local_188);
  }
  mVar10 = QNetworkRequest::transferTimeoutAsDuration(&local_198);
  if (mVar10.__r == 0) {
    QNetworkRequest::setTransferTimeout
              (&local_198,(milliseconds)*(rep *)(*(long *)(this + 8) + 0x100));
  }
  cVar6 = *(char *)(*(long *)(this + 8) + 0xf9);
  if (cVar6 == '\x01') {
    local_b8.shared = (PrivateShared *)0x0;
    local_b8._8_8_ = 0;
    local_b8._16_8_ = 0;
    local_a0 = 2;
    QNetworkRequest::attribute
              (&local_98,&local_198,AutoDeleteReplyOnFinishAttribute,(QVariant *)&local_b8);
    cVar5 = QVariant::isNull();
  }
  else {
    cVar5 = '\0';
  }
  if (cVar6 != '\0') {
    QVariant::~QVariant(&local_98);
    QVariant::~QVariant((QVariant *)&local_b8);
  }
  if (cVar5 != '\0') {
    QVariant::QVariant((QVariant *)local_188,true);
    QNetworkRequest::setAttribute(&local_198,AutoDeleteReplyOnFinishAttribute,(QVariant *)local_188)
    ;
    QVariant::~QVariant((QVariant *)local_188);
  }
  QNetworkRequest::url((QNetworkRequest *)&local_188[0].shared);
  cVar6 = QUrl::isLocalFile();
  QUrl::~QUrl((QUrl *)&local_188[0].shared);
  local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_1b0 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)&local_188[0].shared);
  QUrl::scheme();
  QUrl::~QUrl((QUrl *)&local_188[0].shared);
  if ((local_1a8 == (undefined1 *)0xa) &&
     (QVar14.m_data = psStack_1b0, QVar14.m_size = 10, QVar19.m_data = "local+http",
     QVar19.m_size = 10, cVar5 = QtPrivate::equalStrings(QVar14,QVar19), pQVar4 = local_1b8,
     cVar5 != '\0')) {
    local_1b8 = (QArrayData *)0x0;
    psStack_1b0 = L"unix+http";
    local_1a8 = (undefined1 *)0x9;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    local_188[0].shared = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)&local_188[0].shared);
    QUrl::setScheme((QString *)local_188[0].data);
    QNetworkRequest::setUrl(&local_198,(QUrl *)&local_188[0].shared);
    QUrl::~QUrl((QUrl *)&local_188[0].shared);
  }
  op_00 = local_18c;
  if (local_18c - HeadOperation < 2) {
    if (cVar6 != '\0') {
LAB_00180850:
      this_01 = (anon_union_24_3_e3d07ef4_for_data *)operator_new(0x10);
      QNetworkReplyFileImpl::QNetworkReplyFileImpl
                ((QNetworkReplyFileImpl *)this_01->data,(QNetworkAccessManager *)this,&local_198,
                 op_00);
      goto LAB_00180e3b;
    }
    if (local_1a8 == (undefined1 *)0x4) {
      QVar16.m_data = psStack_1b0;
      QVar16.m_size = 4;
      QVar21.m_data = "data";
      QVar21.m_size = 4;
      cVar6 = QtPrivate::equalStrings(QVar16,QVar21);
      if (cVar6 != '\0') {
        this_01 = (anon_union_24_3_e3d07ef4_for_data *)operator_new(0x10);
        QNetworkReplyDataImpl::QNetworkReplyDataImpl
                  ((QNetworkReplyDataImpl *)this_01->data,(QObject *)this,&local_198,op_00);
        goto LAB_00180e3b;
      }
    }
    else if ((local_1a8 == (undefined1 *)0x3) &&
            (QVar15.m_data = psStack_1b0, QVar15.m_size = 3, QVar20.m_data = "qrc",
            QVar20.m_size = 3, cVar6 = QtPrivate::equalStrings(QVar15,QVar20), cVar6 != '\0'))
    goto LAB_00180850;
    QVariant::QVariant((QVariant *)&local_d8,1);
    this_01 = local_188;
    QNetworkRequest::attribute
              ((QVariant *)this_01,&local_198,CacheLoadControlAttribute,(QVariant *)&local_d8);
    iVar9 = QVariant::toInt((bool *)this_01->data);
    QVariant::~QVariant((QVariant *)this_01);
    QVariant::~QVariant((QVariant *)&local_d8);
    if (iVar9 == 3) {
      this_01 = (anon_union_24_3_e3d07ef4_for_data *)operator_new(0x10);
      QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01->data,(QObject *)this);
      pQVar1 = *(QNetworkReplyImplPrivate **)(this_01->data + 8);
      pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
      pDVar2 = (pQVar1->super_QNetworkReplyPrivate).manager.wp.d;
      (pQVar1->super_QNetworkReplyPrivate).manager.wp.d = pDVar11;
      (pQVar1->super_QNetworkReplyPrivate).manager.wp.value = (QObject *)this;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
             (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(pDVar2);
        }
      }
      this_02 = (QNetworkAccessCacheBackend *)operator_new(0x18);
      QNetworkAccessCacheBackend::QNetworkAccessCacheBackend(this_02);
      pQVar1->backend = (QNetworkAccessBackend *)this_02;
      QNetworkAccessBackend::setManagerPrivate
                ((QNetworkAccessBackend *)this_02,*(QNetworkAccessManagerPrivate **)(this + 8));
      QObject::setParent(&pQVar1->backend->super_QObject);
      QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
      QNetworkReplyImplPrivate::setup(pQVar1,local_18c,&local_198,outgoingData);
    }
    if (iVar9 == 3) goto LAB_00180e3b;
  }
  local_1c0.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest(&local_1c0,&local_198);
  local_1c8.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::headers(&local_1c8);
  bVar7 = QHttpHeaders::contains((QHttpHeaders *)&local_1c8,ContentLength);
  if (((outgoingData != (QIODevice *)0x0) && (!bVar7)) &&
     (cVar6 = (**(code **)(*(long *)outgoingData + 0x60))(outgoingData), cVar6 == '\0')) {
    iVar9 = (**(code **)(*(long *)outgoingData + 0x80))(outgoingData);
    QByteArray::number((longlong)local_188,iVar9);
    value.m_size = local_188[0]._16_8_;
    value.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_188[0]._8_8_;
    QHttpHeaders::append((QHttpHeaders *)&local_1c8,ContentLength,value);
    if ((QArrayData *)local_188[0]._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_188[0]._0_8_ = *(int *)local_188[0]._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_188[0]._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_188[0]._0_8_,1,0x10);
      }
    }
  }
  QVariant::QVariant((QVariant *)&local_d8,0);
  QNetworkRequest::attribute
            ((QVariant *)local_188,&local_1c0,CookieLoadControlAttribute,(QVariant *)&local_d8);
  iVar9 = QVariant::toInt((bool *)local_188[0].data);
  QVariant::~QVariant((QVariant *)local_188);
  QVariant::~QVariant((QVariant *)&local_d8);
  if ((iVar9 == 0) && (pQVar3 = this_00->cookieJar, pQVar3 != (QNetworkCookieJar *)0x0)) {
    local_188[0]._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_188[0].shared = &DAT_aaaaaaaaaaaaaaaa;
    local_188[0]._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QNetworkRequest::url((QNetworkRequest *)&local_d8.shared);
    (**(code **)(*(long *)pQVar3 + 0x60))(local_188,pQVar3,&local_d8);
    QUrl::~QUrl((QUrl *)&local_d8.shared);
    if ((undefined1 *)local_188[0]._16_8_ != (undefined1 *)0x0) {
      QNetworkHeadersPrivate::fromCookieList
                ((QByteArray *)&local_d8,(QList<QNetworkCookie> *)local_188);
      newValue.m_size = local_d8._16_8_;
      newValue.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)local_d8._8_8_;
      QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_1c8,Cookie,newValue);
      if ((QArrayData *)local_d8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_d8.shared = *(int *)local_d8.shared + -1;
        UNLOCK();
        if (*(int *)local_d8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_d8.shared,1,0x10);
        }
      }
    }
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer
              ((QArrayDataPointer<QNetworkCookie> *)local_188);
  }
  QNetworkRequest::setHeaders(&local_1c0,(QHttpHeaders *)&local_1c8);
  memcpy(local_188,L"http",0xaa);
  pacVar12 = const(local_188,(char16_t (*) [17])local_de,&local_1b8);
  if (pacVar12 == (char16_t (*) [17])local_de) {
    this_01 = (anon_union_24_3_e3d07ef4_for_data *)operator_new(0x10);
    QNetworkReplyImpl::QNetworkReplyImpl((QNetworkReplyImpl *)this_01->data,(QObject *)this);
    pQVar1 = *(QNetworkReplyImplPrivate **)(this_01->data + 8);
    pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    pDVar2 = (pQVar1->super_QNetworkReplyPrivate).manager.wp.d;
    (pQVar1->super_QNetworkReplyPrivate).manager.wp.d = pDVar11;
    (pQVar1->super_QNetworkReplyPrivate).manager.wp.value = (QObject *)this;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDVar2);
      }
    }
    pQVar13 = &QNetworkAccessManagerPrivate::findBackend(this_00,local_18c,&local_1c0)->
               super_QObject;
    pQVar1->backend = (QNetworkAccessBackend *)pQVar13;
    if (pQVar13 != (QObject *)0x0) {
      QObject::setParent(pQVar13);
      QNetworkAccessBackend::setReplyPrivate((QNetworkAccessBackend *)pQVar1->backend,pQVar1);
    }
    QNetworkRequest::sslConfiguration((QNetworkRequest *)&local_d8.shared);
    QNetworkReply::setSslConfiguration
              ((QNetworkReply *)this_01,(QSslConfiguration *)&local_d8.shared);
    QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_d8.shared);
    QNetworkReplyImplPrivate::setup(pQVar1,local_18c,&local_1c0,outgoingData);
  }
  else {
    QVar17.m_data = &DAT_00000004;
    QVar17.m_size = (qsizetype)&local_1b8;
    cVar6 = QString::startsWith(QVar17,0x25edcb);
    if ((cVar6 == '\0') && (*(char *)(*(long *)(this + 8) + 0xf8) == '\x01')) {
      QNetworkRequest::url(&local_1d0);
      bVar8 = QHstsCache::isKnownHost(&this_00->stsCache,(QUrl *)&local_1d0);
      bVar7 = true;
    }
    else {
      bVar7 = false;
      bVar8 = false;
    }
    if (bVar7) {
      QUrl::~QUrl((QUrl *)&local_1d0);
    }
    if (bVar8 != false) {
      local_1d8.d.d.ptr = (QSharedDataPointer<QNetworkRequestPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QNetworkRequest::url(&local_1d8);
      iVar9 = QUrl::port((int)&local_1d8);
      if (iVar9 == 0x50) {
        QUrl::setPort((int)&local_1d8);
      }
      QVar18.m_data = (storage_type *)0x5;
      QVar18.m_size = (qsizetype)&local_d8;
      QString::fromLatin1(QVar18);
      QUrl::setScheme((QString *)&local_1d8);
      if ((QArrayData *)local_d8.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_d8.shared = *(int *)local_d8.shared + -1;
        UNLOCK();
        if (*(int *)local_d8.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_d8.shared,2,0x10);
        }
      }
      QNetworkRequest::setUrl(&local_1c0,(QUrl *)&local_1d8);
      QUrl::~QUrl((QUrl *)&local_1d8);
    }
    this_01 = (anon_union_24_3_e3d07ef4_for_data *)operator_new(0x10);
    QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
              ((QNetworkReplyHttpImpl *)this_01->data,(QNetworkAccessManager *)this,&local_1c0,
               &local_18c,outgoingData);
  }
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_1c8);
  QNetworkRequest::~QNetworkRequest(&local_1c0);
LAB_00180e3b:
  if (local_1b8 != (QArrayData *)0x0) {
    LOCK();
    (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1b8,2,0x10);
    }
  }
  QNetworkRequest::~QNetworkRequest(&local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QNetworkReply *)this_01;
}

Assistant:

QNetworkReply *QNetworkAccessManager::createRequest(QNetworkAccessManager::Operation op,
                                                    const QNetworkRequest &originalReq,
                                                    QIODevice *outgoingData)
{
    Q_D(QNetworkAccessManager);

    QNetworkRequest req(originalReq);
    if (redirectPolicy() != QNetworkRequest::NoLessSafeRedirectPolicy
        && req.attribute(QNetworkRequest::RedirectPolicyAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::RedirectPolicyAttribute, redirectPolicy());
    }

#if QT_CONFIG(http) || defined (Q_OS_WASM)
    if (req.transferTimeoutAsDuration() == 0ms)
        req.setTransferTimeout(transferTimeoutAsDuration());
#endif

    if (autoDeleteReplies()
        && req.attribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute).isNull()) {
        req.setAttribute(QNetworkRequest::AutoDeleteReplyOnFinishAttribute, true);
    }

    bool isLocalFile = req.url().isLocalFile();
    QString scheme = req.url().scheme();

    // Remap local+http to unix+http to make further processing easier
    if (scheme == "local+http"_L1) {
        scheme = u"unix+http"_s;
        QUrl url = req.url();
        url.setScheme(scheme);
        req.setUrl(url);
    }

    // fast path for GET on file:// URLs
    // The QNetworkAccessFileBackend will right now only be used for PUT
    if (op == QNetworkAccessManager::GetOperation
     || op == QNetworkAccessManager::HeadOperation) {
        if (isLocalFile
#ifdef Q_OS_ANDROID
            || scheme == "assets"_L1
#endif
            || scheme == "qrc"_L1) {
            return new QNetworkReplyFileImpl(this, req, op);
        }

        if (scheme == "data"_L1)
            return new QNetworkReplyDataImpl(this, req, op);

        // A request with QNetworkRequest::AlwaysCache does not need any bearer management
        QNetworkRequest::CacheLoadControl mode =
            static_cast<QNetworkRequest::CacheLoadControl>(
                req.attribute(QNetworkRequest::CacheLoadControlAttribute,
                              QNetworkRequest::PreferNetwork).toInt());
        if (mode == QNetworkRequest::AlwaysCache) {
            // FIXME Implement a QNetworkReplyCacheImpl instead, see QTBUG-15106
            QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
            QNetworkReplyImplPrivate *priv = reply->d_func();
            priv->manager = this;
            priv->backend = new QNetworkAccessCacheBackend();
            priv->backend->setManagerPrivate(this->d_func());
            priv->backend->setParent(reply);
            priv->backend->setReplyPrivate(priv);
            priv->setup(op, req, outgoingData);
            return reply;
        }
    }
    QNetworkRequest request = req;
    auto h = request.headers();
#ifndef Q_OS_WASM // Content-length header is not allowed to be set by user in wasm
    if (!h.contains(QHttpHeaders::WellKnownHeader::ContentLength) &&
        outgoingData && !outgoingData->isSequential()) {
        // request has no Content-Length
        // but the data that is outgoing is random-access
        h.append(QHttpHeaders::WellKnownHeader::ContentLength,
                 QByteArray::number(outgoingData->size()));
    }
#endif
    if (static_cast<QNetworkRequest::LoadControl>
        (request.attribute(QNetworkRequest::CookieLoadControlAttribute,
                           QNetworkRequest::Automatic).toInt()) == QNetworkRequest::Automatic) {
        if (d->cookieJar) {
            QList<QNetworkCookie> cookies = d->cookieJar->cookiesForUrl(request.url());
            if (!cookies.isEmpty())
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Cookie,
                                  QNetworkHeadersPrivate::fromCookieList(cookies));
        }
    }
    request.setHeaders(std::move(h));
#ifdef Q_OS_WASM
    Q_UNUSED(isLocalFile);
    // Support http, https, and relative urls
    if (scheme == "http"_L1 || scheme == "https"_L1 || scheme.isEmpty()) {
        QNetworkReplyWasmImpl *reply = new QNetworkReplyWasmImpl(this);
        QNetworkReplyWasmImplPrivate *priv = reply->d_func();
        priv->manager = this;
        priv->setup(op, request, outgoingData);
        return reply;
    }
#endif

#if QT_CONFIG(http)
    constexpr char16_t httpSchemes[][17] = {
        u"http",
        u"preconnect-http",
#ifndef QT_NO_SSL
        u"https",
        u"preconnect-https",
#endif
        u"unix+http",
    };
    // Since Qt 5 we use the new QNetworkReplyHttpImpl
    if (std::find(std::begin(httpSchemes), std::end(httpSchemes), scheme) != std::end(httpSchemes)) {

#ifndef QT_NO_SSL
        const bool isLocalSocket = scheme.startsWith("unix"_L1);
        if (!isLocalSocket && isStrictTransportSecurityEnabled()
            && d->stsCache.isKnownHost(request.url())) {
            QUrl stsUrl(request.url());
            // RFC6797, 8.3:
            // The UA MUST replace the URI scheme with "https" [RFC2818],
            // and if the URI contains an explicit port component of "80",
            // then the UA MUST convert the port component to be "443", or
            // if the URI contains an explicit port component that is not
            // equal to "80", the port component value MUST be preserved;
            // otherwise,
            // if the URI does not contain an explicit port component, the UA
            // MUST NOT add one.
            if (stsUrl.port() == 80)
                stsUrl.setPort(443);
            stsUrl.setScheme("https"_L1);
            request.setUrl(stsUrl);
        }
#endif
        QNetworkReplyHttpImpl *reply = new QNetworkReplyHttpImpl(this, request, op, outgoingData);
        return reply;
    }
#endif // QT_CONFIG(http)

    // first step: create the reply
    QNetworkReplyImpl *reply = new QNetworkReplyImpl(this);
    QNetworkReplyImplPrivate *priv = reply->d_func();
    priv->manager = this;

    // second step: fetch cached credentials
    // This is not done for the time being, we should use signal emissions to request
    // the credentials from cache.

    // third step: find a backend
    priv->backend = d->findBackend(op, request);

    if (priv->backend) {
        priv->backend->setParent(reply);
        priv->backend->setReplyPrivate(priv);
    }

#ifndef QT_NO_SSL
    reply->setSslConfiguration(request.sslConfiguration());
#endif

    // fourth step: setup the reply
    priv->setup(op, request, outgoingData);

    return reply;
}